

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeUnbind(Vdbe *p,int i)

{
  Mem *pMVar1;
  int iVar2;
  uint local_30;
  Mem *pVar;
  int i_local;
  Vdbe *p_local;
  
  iVar2 = vdbeSafetyNotNull(p);
  if (iVar2 == 0) {
    sqlite3_mutex_enter(p->db->mutex);
    if ((p->magic == 0x2df20da3) && (p->pc < 0)) {
      if ((i < 1) || (p->nVar < i)) {
        sqlite3Error(p->db,0x19);
        sqlite3_mutex_leave(p->db->mutex);
        p_local._4_4_ = 0x19;
      }
      else {
        iVar2 = i + -1;
        pMVar1 = p->aVar;
        sqlite3VdbeMemRelease(pMVar1 + iVar2);
        pMVar1[iVar2].flags = 1;
        p->db->errCode = 0;
        if (p->expmask != 0) {
          if (iVar2 < 0x1f) {
            local_30 = 1 << ((byte)iVar2 & 0x1f);
          }
          else {
            local_30 = 0x80000000;
          }
          if ((p->expmask & local_30) != 0) {
            *(ushort *)&p->field_0xc5 = *(ushort *)&p->field_0xc5 & 0xfffc | 1;
          }
        }
        p_local._4_4_ = 0;
      }
    }
    else {
      sqlite3Error(p->db,0x15);
      sqlite3_mutex_leave(p->db->mutex);
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
      p_local._4_4_ = sqlite3MisuseError(0x1428f);
    }
  }
  else {
    p_local._4_4_ = sqlite3MisuseError(0x14287);
  }
  return p_local._4_4_;
}

Assistant:

static int vdbeUnbind(Vdbe *p, int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->magic!=VDBE_MAGIC_RUN || p->pc>=0 ){
    sqlite3Error(p->db, SQLITE_MISUSE);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE, 
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i<1 || i>p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  i--;
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then 
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-48440-37595 If the specific value bound to host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}